

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_AzureStoragePutBlockList
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle)

{
  BLOB_RESULT BVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  IOTHUB_CLIENT_RESULT IVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 uVar7;
  undefined8 uVar6;
  undefined8 uStack_10;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    uStack_10 = 0x1215c3;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      uStack_10 = 0x1215fa;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_AzureStoragePutBlockList",0xbe5,1,
                "invalid parameter azureStorageClientHandle=%p");
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  if (azureStorageClientHandle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    uVar6 = 0;
    pcVar5 = "invalid argument uploadContext=%p";
    IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    iVar3 = 0x404;
  }
  else {
    uStack_10 = uStack_10 & 0xffffffff;
    BVar1 = Blob_PutBlockList(azureStorageClientHandle->blobHttpApiHandle,
                              azureStorageClientHandle->blobStorageRelativePath,
                              azureStorageClientHandle->blockIdList,(uint *)((long)&uStack_10 + 4),
                              (BUFFER_HANDLE)0x0);
    if (BVar1 == BLOB_OK) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var2 = xlogging_get_log_function();
    IVar4 = IOTHUB_CLIENT_ERROR;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    uVar6 = CONCAT44(uVar7,uStack_10._4_4_);
    pcVar5 = "Failed sending block ID list to Blob Storage (%u)";
    iVar3 = 0x412;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
            ,"IoTHubClient_LL_UploadToBlob_PutBlockList",iVar3,1,pcVar5,uVar6);
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_AzureStoragePutBlockList(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT_HANDLE azureStorageClientHandle)
{
    IOTHUB_CLIENT_RESULT result;

    if (azureStorageClientHandle == NULL)
    {
        LogError("invalid parameter azureStorageClientHandle=%p", azureStorageClientHandle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        result = IoTHubClient_LL_UploadToBlob_PutBlockList(azureStorageClientHandle);
    }

    return result;
}